

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

void notify_parent_process(void)

{
  int fd;
  char *__nptr;
  
  __nptr = getenv("UV_TEST_RUNNER_FD");
  if (__nptr == (char *)0x0) {
    return;
  }
  fd = atoi(__nptr);
  if (2 < fd) {
    unsetenv("UV_TEST_RUNNER_FD");
    closefd(fd);
    return;
  }
  __assert_fail("fd > STDERR_FILENO",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/runner-unix.c"
                ,0x3f,"void notify_parent_process(void)");
}

Assistant:

void notify_parent_process(void) {
  char* arg;
  int fd;

  arg = getenv("UV_TEST_RUNNER_FD");
  if (arg == NULL)
    return;

  fd = atoi(arg);
  assert(fd > STDERR_FILENO);
  unsetenv("UV_TEST_RUNNER_FD");
  closefd(fd);
}